

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status
parse_query_item(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  curi_status cVar6;
  char *pcVar7;
  char c_1;
  size_t previousOffset_1;
  size_t valueStartOffset;
  char c;
  size_t previousOffset;
  curi_status status;
  size_t keyEndOffset;
  size_t keyStartOffset;
  void *userData_local;
  curi_settings *settings_local;
  size_t *offset_local;
  size_t len_local;
  char *uri_local;
  
  sVar2 = *offset;
  previousOffset._4_4_ = curi_status_success;
  while (previousOffset._4_4_ == curi_status_success) {
    sVar3 = *offset;
    pcVar7 = read_char(uri,len,offset);
    cVar1 = *pcVar7;
    if (cVar1 == settings->query_item_separator) {
      previousOffset._4_4_ = curi_status_error;
    }
    else if (cVar1 == settings->query_item_key_separator) {
      previousOffset._4_4_ = curi_status_error;
    }
    else {
      switch(cVar1) {
      case '!':
      case '$':
      case '&':
      case '\'':
      case '(':
      case ')':
      case '*':
      case '+':
      case ',':
      case '-':
      case '.':
      case '/':
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
      case ':':
      case ';':
      case '=':
      case '?':
      case '@':
      case 'A':
      case 'B':
      case 'C':
      case 'D':
      case 'E':
      case 'F':
      case 'G':
      case 'H':
      case 'I':
      case 'J':
      case 'K':
      case 'L':
      case 'M':
      case 'N':
      case 'O':
      case 'P':
      case 'Q':
      case 'R':
      case 'S':
      case 'T':
      case 'U':
      case 'V':
      case 'W':
      case 'X':
      case 'Y':
      case 'Z':
      case '_':
      case 'a':
      case 'b':
      case 'c':
      case 'd':
      case 'e':
      case 'f':
      case 'g':
      case 'h':
      case 'i':
      case 'j':
      case 'k':
      case 'l':
      case 'm':
      case 'n':
      case 'o':
      case 'p':
      case 'q':
      case 'r':
      case 's':
      case 't':
      case 'u':
      case 'v':
      case 'w':
      case 'x':
      case 'y':
      case 'z':
      case '~':
        previousOffset._4_4_ = curi_status_success;
        break;
      default:
        previousOffset._4_4_ = curi_status_error;
        break;
      case '%':
        previousOffset._4_4_ = parse_h8(uri,len,offset,settings,userData);
      }
    }
    if (previousOffset._4_4_ != curi_status_success) {
      *offset = sVar3;
    }
  }
  sVar3 = *offset;
  cVar6 = parse_char(settings->query_item_key_separator,uri,len,offset,settings,userData);
  if (cVar6 == curi_status_success) {
    sVar4 = *offset;
    previousOffset._4_4_ = curi_status_success;
    while (previousOffset._4_4_ == curi_status_success) {
      sVar5 = *offset;
      pcVar7 = read_char(uri,len,offset);
      if (*pcVar7 == settings->query_item_separator) {
        previousOffset._4_4_ = curi_status_error;
      }
      else {
        switch(*pcVar7) {
        case '!':
        case '$':
        case '&':
        case '\'':
        case '(':
        case ')':
        case '*':
        case '+':
        case ',':
        case '-':
        case '.':
        case '/':
        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7':
        case '8':
        case '9':
        case ':':
        case ';':
        case '=':
        case '?':
        case '@':
        case 'A':
        case 'B':
        case 'C':
        case 'D':
        case 'E':
        case 'F':
        case 'G':
        case 'H':
        case 'I':
        case 'J':
        case 'K':
        case 'L':
        case 'M':
        case 'N':
        case 'O':
        case 'P':
        case 'Q':
        case 'R':
        case 'S':
        case 'T':
        case 'U':
        case 'V':
        case 'W':
        case 'X':
        case 'Y':
        case 'Z':
        case '_':
        case 'a':
        case 'b':
        case 'c':
        case 'd':
        case 'e':
        case 'f':
        case 'g':
        case 'h':
        case 'i':
        case 'j':
        case 'k':
        case 'l':
        case 'm':
        case 'n':
        case 'o':
        case 'p':
        case 'q':
        case 'r':
        case 's':
        case 't':
        case 'u':
        case 'v':
        case 'w':
        case 'x':
        case 'y':
        case 'z':
        case '~':
          previousOffset._4_4_ = curi_status_success;
          break;
        default:
          previousOffset._4_4_ = curi_status_error;
          break;
        case '%':
          previousOffset._4_4_ = parse_h8(uri,len,offset,settings,userData);
        }
      }
      if (previousOffset._4_4_ != curi_status_success) {
        *offset = sVar5;
      }
    }
    previousOffset._4_4_ =
         handle_query_item(uri + sVar2,sVar3 - sVar2,uri + sVar4,*offset - sVar4,settings,userData);
  }
  else {
    *offset = sVar3;
    previousOffset._4_4_ =
         handle_query_item(uri + sVar2,sVar3 - sVar2,(char *)0x0,0,settings,userData);
  }
  return previousOffset._4_4_;
}

Assistant:

static curi_status parse_query_item(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // query_item = query_item_key [query_item_key_separator query_item_value]
    // query_item_key = *query_fragment_char (but no query_item_separator or query_item_key_separator)
    // query_item_separator = settings->query_item_separator (default is "&")
    // query_item_key_separator = settings->query_item_key_separator (default is "=")
    // query_item_value = *query_fragment_char (but no query_item_separator)

    const size_t keyStartOffset = *offset;
    size_t keyEndOffset;

    curi_status status = curi_status_success;
    while (status == curi_status_success)
    {
        size_t previousOffset = *offset;

        char c = *read_char(uri, len, offset);
        if (c == settings->query_item_separator)
            status = curi_status_error;
        else if (c == settings->query_item_key_separator)
            status = curi_status_error;
        else
        {
            switch (c)
            {
                CASE_QUERY_FRAGMENT_CHAR_NO_PCT:
                    status = curi_status_success;
                    break;
                case '%':
                    status = parse_h8(uri, len, offset, settings, userData);
                    break;
                default:
                    status = curi_status_error;
                    break;
            }
        }

        if (status != curi_status_success)
            *offset = previousOffset;
    };

    keyEndOffset = *offset;

    status = parse_char(settings->query_item_key_separator, uri, len, offset, settings, userData);

    if (status == curi_status_success)
    {
        // There is a value
        const size_t valueStartOffset = *offset;

        while (status == curi_status_success)
        {
            size_t previousOffset = *offset;

            char c = *read_char(uri, len, offset);
            if (c == settings->query_item_separator)
                status = curi_status_error;
            else
            {
                switch (c)
                {
                    CASE_QUERY_FRAGMENT_CHAR_NO_PCT:
                        status = curi_status_success;
                        break;
                    case '%':
                        status = parse_h8(uri, len, offset, settings, userData);
                        break;
                    default:
                        status = curi_status_error;
                        break;
                }
            }

            if (status != curi_status_success)
                *offset = previousOffset;
        }

        status = handle_query_item(uri + keyStartOffset, keyEndOffset - keyStartOffset, uri + valueStartOffset, *offset - valueStartOffset, settings, userData);
    }
    else
    {
        *offset = keyEndOffset;
        // There is no value
        status = handle_query_item(uri + keyStartOffset, keyEndOffset - keyStartOffset, 0, 0, settings, userData);
    }

    return status;
}